

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

void free_parser(vw *all)

{
  parser *ppVar1;
  substring *psVar2;
  unsigned_long *puVar3;
  io_buf *piVar4;
  char *pcVar5;
  
  ppVar1 = all->p;
  psVar2 = (ppVar1->words)._begin;
  if (psVar2 != (substring *)0x0) {
    free(psVar2);
  }
  (ppVar1->words)._begin = (substring *)0x0;
  (ppVar1->words)._end = (substring *)0x0;
  (ppVar1->words).end_array = (substring *)0x0;
  ppVar1 = all->p;
  psVar2 = (ppVar1->name)._begin;
  if (psVar2 != (substring *)0x0) {
    free(psVar2);
  }
  (ppVar1->name)._begin = (substring *)0x0;
  (ppVar1->name)._end = (substring *)0x0;
  (ppVar1->name).end_array = (substring *)0x0;
  if ((all->ngram_strings).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (all->ngram_strings).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    ppVar1 = all->p;
    puVar3 = (ppVar1->gram_mask)._begin;
    if (puVar3 != (unsigned_long *)0x0) {
      free(puVar3);
    }
    (ppVar1->gram_mask)._begin = (unsigned_long *)0x0;
    (ppVar1->gram_mask)._end = (unsigned_long *)0x0;
    (ppVar1->gram_mask).end_array = (unsigned_long *)0x0;
  }
  piVar4 = all->p->output;
  if (piVar4 != (io_buf *)0x0) {
    pcVar5 = (piVar4->finalname)._begin;
    if (pcVar5 != (char *)0x0) {
      free(pcVar5);
    }
    (piVar4->finalname)._begin = (char *)0x0;
    (piVar4->finalname)._end = (char *)0x0;
    (piVar4->finalname).end_array = (char *)0x0;
    pcVar5 = (piVar4->currentname)._begin;
    if (pcVar5 != (char *)0x0) {
      free(pcVar5);
    }
    (piVar4->currentname)._begin = (char *)0x0;
    (piVar4->currentname)._end = (char *)0x0;
    (piVar4->currentname).end_array = (char *)0x0;
  }
  ppVar1 = all->p;
  puVar3 = (ppVar1->counts)._begin;
  if (puVar3 != (unsigned_long *)0x0) {
    free(puVar3);
  }
  (ppVar1->counts)._begin = (unsigned_long *)0x0;
  (ppVar1->counts)._end = (unsigned_long *)0x0;
  (ppVar1->counts).end_array = (unsigned_long *)0x0;
  return;
}

Assistant:

void free_parser(vw& all)
{
  all.p->words.delete_v();
  all.p->name.delete_v();

  if (all.ngram_strings.size() > 0)
    all.p->gram_mask.delete_v();

  io_buf* output = all.p->output;
  if (output != nullptr)
  {
    output->finalname.delete_v();
    output->currentname.delete_v();
  }

  all.p->counts.delete_v();
}